

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleTransformNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  DeadlyImportError *pDVar1;
  allocator<char> local_81;
  string local_80;
  DataArrayList *local_60;
  DataArrayList *transformData;
  allocator<char> local_41;
  string local_40;
  aiScene *local_20;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  local_20 = param_2;
  param_2_local = (aiScene *)node;
  node_local = (DDLNode *)this;
  if (this->m_currentNode == (aiNode *)0x0) {
    transformData._3_1_ = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No parent node for name.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_40);
    transformData._3_1_ = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_60 = ODDLParser::DDLNode::getDataArrayList(node);
  if (local_60 != (DataArrayList *)0x0) {
    if (local_60->m_numItems != 0x10) {
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Invalid number of data for transform matrix.",&local_81);
      DeadlyImportError::DeadlyImportError(pDVar1,&local_80);
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    setMatrix(this->m_currentNode,local_60);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleTransformNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == m_currentNode ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    DataArrayList *transformData( node->getDataArrayList() );
    if( nullptr != transformData ) {
        if( transformData->m_numItems != 16 ) {
            throw DeadlyImportError( "Invalid number of data for transform matrix." );
            return;
        }
        setMatrix( m_currentNode, transformData );
    }
}